

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_matrix.cpp
# Opt level: O2

void ScalarTimesMatrix(double s,Matrix m,Matrix product)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  
  bVar3 = *(byte *)((long)m + -7);
  if (bVar3 == *(byte *)((long)product + -7)) {
    bVar2 = *(byte *)((long)m + -6);
    if (bVar2 == *(byte *)((long)product + -6)) {
      for (uVar1 = 0; uVar1 < bVar3; uVar1 = uVar1 + 1) {
        for (uVar4 = 0; uVar4 < bVar2; uVar4 = uVar4 + 1) {
          product[uVar1][uVar4] = m[uVar1][uVar4] * s;
          bVar2 = *(byte *)((long)m + -6);
        }
        bVar3 = *(byte *)((long)m + -7);
      }
      return;
    }
  }
  Am_Error("ScalarTimesMatrix");
}

Assistant:

void
ScalarTimesMatrix(double s, Matrix m, Matrix product)
{
  int i, j;

  if (NROWS(m) != NROWS(product) || NCOLS(m) != NCOLS(product))
    Am_Error("ScalarTimesMatrix"); //: result wrong size (%d!=%d)or(%d!=%d)",
  //NROWS(m), NROWS(product),
  //NCOLS(m), NCOLS(product));

  for (i = 0; i < NROWS(m); i++)
    for (j = 0; j < NCOLS(m); j++)
      product[i][j] = s * m[i][j];
}